

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

TestInfo * __thiscall testing::UnitTest::current_test_info(UnitTest *this)

{
  TestInfo *pTVar1;
  
  internal::MutexBase::Lock(&(this->mutex_).super_MutexBase);
  pTVar1 = this->impl_->current_test_info_;
  internal::MutexBase::Unlock(&(this->mutex_).super_MutexBase);
  return pTVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_info();
}